

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O0

void __thiscall ExchangePaths_ImportEmpty_Test::TestBody(ExchangePaths_ImportEmpty_Test *this)

{
  bool bVar1;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  Message *pMVar2;
  error_code *this_01;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_280;
  Message local_278;
  error local_26c;
  error_or<pstore::typed_address<pstore::indirect_string>_> local_268;
  undefined1 local_250 [8];
  AssertionResult gtest_ar;
  string local_230;
  AssertHelper local_210;
  char local_205;
  coord local_204;
  char local_1f9;
  string local_1f8;
  Message local_1d8;
  bool local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  parser<pstore::exchange::import_ns::callbacks> name_parser;
  string_mapping imported_paths;
  unique_lock<mock_mutex> local_80;
  undefined1 local_70 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_30 [7];
  mock_mutex mutex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> exported_paths;
  ExchangePaths_ImportEmpty_Test *this_local;
  
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,"[]\n",
               3);
  std::unique_lock<mock_mutex>::unique_lock(&local_80,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_70,
          &(this->super_ExchangePaths).import_db_,&local_80);
  std::unique_lock<mock_mutex>::~unique_lock(&local_80);
  pstore::exchange::import_ns::string_mapping::string_mapping
            ((string_mapping *)&name_parser.coordinate_);
  anon_unknown.dwarf_2b80ee::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
             (transaction *)local_70,(string_mapping *)&name_parser.coordinate_);
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
                       (string *)local_30);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  local_1c9 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  local_1c9 = !local_1c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c8,&local_1c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pMVar2 = testing::Message::operator<<(&local_1d8,(char (*) [17])"JSON error was: ");
    this_01 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    std::error_code::message_abi_cxx11_(&local_1f8,this_01);
    pMVar2 = testing::Message::operator<<(pMVar2,&local_1f8);
    local_1f9 = ' ';
    pMVar2 = testing::Message::operator<<(pMVar2,&local_1f9);
    local_204 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                          ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    pMVar2 = testing::Message::operator<<(pMVar2,&local_204);
    local_205 = '\n';
    pMVar2 = testing::Message::operator<<(pMVar2,&local_205);
    pMVar2 = testing::Message::operator<<
                       (pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_230,(internal *)local_1c8,(AssertionResult *)"name_parser.has_error ()","true"
               ,"false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=(&local_210,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_1f8);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  if (bVar1) {
    pstore::gsl::not_null<pstore::transaction_base_*>::not_null
              ((not_null<pstore::transaction_base_*> *)&gtest_ar.message_,
               (transaction_base *)local_70);
    pstore::exchange::import_ns::string_mapping::flush
              ((string_mapping *)&name_parser.coordinate_,
               (not_null<transaction_base_*>)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    pstore::transaction_base::commit((transaction_base *)local_70);
    pstore::exchange::import_ns::string_mapping::lookup
              (&local_268,(string_mapping *)&name_parser.coordinate_,0);
    local_26c = no_such_name;
    testing::internal::EqHelper::
    Compare<pstore::error_or<pstore::typed_address<pstore::indirect_string>_>,_pstore::exchange::import_ns::error,_nullptr>
              ((EqHelper *)local_250,"imported_paths.lookup (0U)",
               "pstore::exchange::import_ns::error::no_such_name",&local_268,&local_26c);
    pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::~error_or(&local_268);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
      testing::internal::AssertHelper::AssertHelper
                (&local_280,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                 ,0x72,pcVar3);
      testing::internal::AssertHelper::operator=(&local_280,&local_278);
      testing::internal::AssertHelper::~AssertHelper(&local_280);
      testing::Message::~Message(&local_278);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping
            ((string_mapping *)&name_parser.coordinate_);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_70);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F (ExchangePaths, ImportEmpty) {
    auto const exported_paths = "[]\n"s;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});

    pstore::exchange::import_ns::string_mapping imported_paths;
    {
        auto name_parser = import_strings_parser (&transaction, &imported_paths);
        name_parser.input (exported_paths).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_paths;
    }

    imported_paths.flush (&transaction);
    transaction.commit ();

    EXPECT_EQ (imported_paths.lookup (0U), pstore::exchange::import_ns::error::no_such_name);
}